

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

void __thiscall Matrix::One(Matrix *this)

{
  double **ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->colNo;
  if (this->colNo < 1) {
    uVar3 = uVar4;
  }
  uVar2 = (ulong)(uint)this->rowNo;
  if (this->rowNo < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    ppdVar1 = this->array;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      ppdVar1[uVar4][uVar5] = 1.0;
    }
  }
  return;
}

Assistant:

void Matrix::One()
{

    for (int i = 0; i < rowNo; i++)
    {
        for (int j = 0; j < colNo; j++)
        {
            array[i][j] = 1;
        }
    }

}